

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O2

Error __thiscall
asmjit::v1_14::RAInstBuilder::add
          (RAInstBuilder *this,RAWorkReg *workReg,RATiedFlags flags,RegMask useRegMask,
          uint32_t useId,uint32_t useRewriteMask,RegMask outRegMask,uint32_t outId,
          uint32_t outRewriteMask,uint32_t rmSize,uint32_t consecutiveParent)

{
  long lVar1;
  undefined4 *puVar2;
  RegGroup RVar3;
  uint *puVar4;
  byte bVar5;
  RegGroup group;
  RegMask local_44;
  uint32_t local_40;
  uint32_t local_3c;
  RAWorkReg *local_38;
  
  RVar3 = (RegGroup)((uint)*(undefined4 *)(workReg + 0x20) >> 8);
  group = RVar3 & kMaxValue;
  lVar1 = *(long *)(workReg + 0x10);
  local_44 = useRegMask;
  local_40 = useRewriteMask;
  local_38 = workReg;
  if (useId != 0xff) {
    *(uint *)(this + 0x14) = *(uint *)(this + 0x14) | 0x100 << (RVar3 & kMaxValue);
    puVar4 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<unsigned_int,_4UL> *)(this + 0x18),&group);
    *puVar4 = *puVar4 | 1 << ((byte)useId & 0x1f);
    flags = flags | kUseFixed;
  }
  bVar5 = (byte)outId;
  if (outId != 0xff) {
    local_3c = useId;
    puVar4 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<unsigned_int,_4UL> *)(this + 0x28),&group);
    *puVar4 = *puVar4 | 1 << (bVar5 & 0x1f);
    flags = flags | kOutFixed;
    useId = local_3c;
  }
  *(RATiedFlags *)(this + 8) = *(RATiedFlags *)(this + 8) | flags;
  *(uint *)(this + 0x14) = *(uint *)(this + 0x14) | 1 << (group & 0x1f);
  if (lVar1 == 0) {
    puVar2 = *(undefined4 **)(this + 0x38);
    if (((long)puVar2 + (-0x40 - (long)this) & 0x1ffffff000U) != 0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../arm/../core/../core/rapass_p.h"
                 ,0x202,"tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs)");
    }
    *(undefined4 **)(this + 0x38) = puVar2 + 8;
    *puVar2 = *(undefined4 *)local_38;
    puVar2[1] = consecutiveParent;
    puVar2[2] = flags;
    *(undefined1 *)(puVar2 + 3) = 1;
    *(byte *)((long)puVar2 + 0xd) = (byte)rmSize;
    *(char *)((long)puVar2 + 0xe) = (char)useId;
    *(byte *)((long)puVar2 + 0xf) = bVar5;
    puVar2[4] = local_44;
    puVar2[5] = outRegMask;
    puVar2[6] = local_40;
    puVar2[7] = outRewriteMask;
    *(undefined4 **)(local_38 + 0x10) = puVar2;
    *(undefined4 *)(local_38 + 0x28) = *(undefined4 *)this;
    RARegCount::add((RARegCount *)(this + 0x10),group,1);
  }
  else {
    if (*(uint32_t *)(lVar1 + 4) != consecutiveParent) {
      if (*(uint32_t *)(lVar1 + 4) != 0xffffffff) {
        return 3;
      }
      *(uint32_t *)(lVar1 + 4) = consecutiveParent;
    }
    if (useId != 0xff) {
      if (*(char *)(lVar1 + 0xe) != -1) {
        return 0x41;
      }
      *(char *)(lVar1 + 0xe) = (char)useId;
    }
    if (outId != 0xff) {
      if (*(char *)(lVar1 + 0xf) != -1) {
        return 0x41;
      }
      *(byte *)(lVar1 + 0xf) = bVar5;
    }
    *(char *)(lVar1 + 0xc) = *(char *)(lVar1 + 0xc) + '\x01';
    *(RATiedFlags *)(lVar1 + 8) = *(RATiedFlags *)(lVar1 + 8) | flags;
    *(uint *)(lVar1 + 0x10) = *(uint *)(lVar1 + 0x10) & local_44;
    *(uint *)(lVar1 + 0x18) = *(uint *)(lVar1 + 0x18) | local_40;
    *(uint *)(lVar1 + 0x14) = *(uint *)(lVar1 + 0x14) & outRegMask;
    *(uint *)(lVar1 + 0x1c) = *(uint *)(lVar1 + 0x1c) | outRewriteMask;
    bVar5 = (byte)rmSize;
    if (rmSize < *(byte *)(lVar1 + 0xd)) {
      bVar5 = *(byte *)(lVar1 + 0xd);
    }
    *(byte *)(lVar1 + 0xd) = bVar5;
  }
  return 0;
}

Assistant:

Error add(
    RAWorkReg* workReg,
    RATiedFlags flags,
    RegMask useRegMask, uint32_t useId, uint32_t useRewriteMask,
    RegMask outRegMask, uint32_t outId, uint32_t outRewriteMask,
    uint32_t rmSize = 0,
    uint32_t consecutiveParent = Globals::kInvalidId
  ) noexcept {
    RegGroup group = workReg->group();
    RATiedReg* tiedReg = workReg->tiedReg();

    if (useId != BaseReg::kIdBad) {
      _stats.makeFixed(group);
      _used[group] |= Support::bitMask(useId);
      flags |= RATiedFlags::kUseFixed;
    }

    if (outId != BaseReg::kIdBad) {
      _clobbered[group] |= Support::bitMask(outId);
      flags |= RATiedFlags::kOutFixed;
    }

    _aggregatedFlags |= flags;
    _stats.makeUsed(group);

    if (!tiedReg) {
      // Would happen when the builder is not reset properly after each instruction - so catch that!
      ASMJIT_ASSERT(tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs));

      tiedReg = _cur++;
      tiedReg->init(workReg->workId(), flags, useRegMask, useId, useRewriteMask, outRegMask, outId, outRewriteMask, rmSize, consecutiveParent);

      workReg->setTiedReg(tiedReg);
      workReg->assignBasicBlock(_basicBlockId);

      _count.add(group);
      return kErrorOk;
    }
    else {
      if (consecutiveParent != tiedReg->consecutiveParent()) {
        if (tiedReg->consecutiveParent() != Globals::kInvalidId)
          return DebugUtils::errored(kErrorInvalidState);
        tiedReg->_consecutiveParent = consecutiveParent;
      }

      if (useId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasUseId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setUseId(useId);
      }

      if (outId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasOutId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setOutId(outId);
      }

      tiedReg->addRefCount();
      tiedReg->addFlags(flags);
      tiedReg->_useRegMask &= useRegMask;
      tiedReg->_useRewriteMask |= useRewriteMask;
      tiedReg->_outRegMask &= outRegMask;
      tiedReg->_outRewriteMask |= outRewriteMask;
      tiedReg->_rmSize = uint8_t(Support::max<uint32_t>(tiedReg->rmSize(), rmSize));
      return kErrorOk;
    }
  }